

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.h
# Opt level: O0

void bitrv2(int n,int *ip,float *a)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  float yi;
  float yr;
  float xi;
  float xr;
  int m2;
  int m;
  int l;
  int k1;
  int k;
  int j1;
  int j;
  float *a_local;
  int *ip_local;
  int n_local;
  
  *ip = 0;
  l = n;
  for (m = 1; m * 8 < l; m = m << 1) {
    l = l >> 1;
    for (j = 0; j < m; j = j + 1) {
      ip[m + j] = ip[j] + l;
    }
  }
  iVar4 = m * 2;
  if (m << 3 == l) {
    for (k = 0; k < m; k = k + 1) {
      for (j = 0; j < k; j = j + 1) {
        iVar5 = j * 2 + ip[k];
        iVar6 = k * 2 + ip[j];
        fVar1 = a[iVar5];
        fVar2 = a[iVar5 + 1];
        fVar3 = a[iVar6 + 1];
        a[iVar5] = a[iVar6];
        a[iVar5 + 1] = fVar3;
        a[iVar6] = fVar1;
        a[iVar6 + 1] = fVar2;
        iVar5 = iVar4 + iVar5;
        iVar6 = m * 4 + iVar6;
        fVar1 = a[iVar5];
        fVar2 = a[iVar5 + 1];
        fVar3 = a[iVar6 + 1];
        a[iVar5] = a[iVar6];
        a[iVar5 + 1] = fVar3;
        a[iVar6] = fVar1;
        a[iVar6 + 1] = fVar2;
        iVar5 = iVar4 + iVar5;
        iVar6 = iVar6 + m * -2;
        fVar1 = a[iVar5];
        fVar2 = a[iVar5 + 1];
        fVar3 = a[iVar6 + 1];
        a[iVar5] = a[iVar6];
        a[iVar5 + 1] = fVar3;
        a[iVar6] = fVar1;
        a[iVar6 + 1] = fVar2;
        iVar5 = iVar4 + iVar5;
        iVar6 = m * 4 + iVar6;
        fVar1 = a[iVar5];
        fVar2 = a[iVar5 + 1];
        fVar3 = a[iVar6 + 1];
        a[iVar5] = a[iVar6];
        a[iVar5 + 1] = fVar3;
        a[iVar6] = fVar1;
        a[iVar6 + 1] = fVar2;
      }
      iVar5 = k * 2 + iVar4 + ip[k];
      iVar6 = iVar5 + iVar4;
      fVar1 = a[iVar5];
      fVar2 = a[iVar5 + 1];
      fVar3 = a[iVar6 + 1];
      a[iVar5] = a[iVar6];
      a[iVar5 + 1] = fVar3;
      a[iVar6] = fVar1;
      a[iVar6 + 1] = fVar2;
    }
  }
  else {
    for (k = 1; k < m; k = k + 1) {
      for (j = 0; j < k; j = j + 1) {
        iVar5 = j * 2 + ip[k];
        iVar6 = k * 2 + ip[j];
        fVar1 = a[iVar5];
        fVar2 = a[iVar5 + 1];
        fVar3 = a[iVar6 + 1];
        a[iVar5] = a[iVar6];
        a[iVar5 + 1] = fVar3;
        a[iVar6] = fVar1;
        a[iVar6 + 1] = fVar2;
        iVar5 = iVar4 + iVar5;
        iVar6 = iVar4 + iVar6;
        fVar1 = a[iVar5];
        fVar2 = a[iVar5 + 1];
        fVar3 = a[iVar6 + 1];
        a[iVar5] = a[iVar6];
        a[iVar5 + 1] = fVar3;
        a[iVar6] = fVar1;
        a[iVar6 + 1] = fVar2;
      }
    }
  }
  return;
}

Assistant:

void bitrv2(int n, int *ip, float *a)
{
    int j, j1, k, k1, l, m, m2;
    float xr, xi, yr, yi;

    ip[0] = 0;
    l = n;
    m = 1;
    while ((m << 3) < l) {
        l >>= 1;
        for (j = 0; j < m; j++) {
            ip[m + j] = ip[j] + l;
        }
        m <<= 1;
    }
    m2 = 2 * m;
    if ((m << 3) == l) {
        for (k = 0; k < m; k++) {
            for (j = 0; j < k; j++) {
                j1 = 2 * j + ip[k];
                k1 = 2 * k + ip[j];
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 += 2 * m2;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 -= m2;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 += 2 * m2;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
            }
            j1 = 2 * k + m2 + ip[k];
            k1 = j1 + m2;
            xr = a[j1];
            xi = a[j1 + 1];
            yr = a[k1];
            yi = a[k1 + 1];
            a[j1] = yr;
            a[j1 + 1] = yi;
            a[k1] = xr;
            a[k1 + 1] = xi;
        }
    } else {
        for (k = 1; k < m; k++) {
            for (j = 0; j < k; j++) {
                j1 = 2 * j + ip[k];
                k1 = 2 * k + ip[j];
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 += m2;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
            }
        }
    }
}